

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::Table::Init
          (Table *this,Store *store,u32 dst_offset,ElemSegment *src,u32 src_offset,u32 size)

{
  pointer pRVar1;
  pointer pRVar2;
  ulong uVar3;
  Enum EVar4;
  ulong uVar5;
  uint uVar6;
  
  pRVar1 = (this->elements_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(this->elements_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pRVar1 >> 3;
  uVar3 = (ulong)size;
  EVar4 = Error;
  if ((((ulong)dst_offset <= uVar5 - uVar3 && uVar3 <= uVar5) &&
      (pRVar2 = (src->elements_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar6 = (uint)((ulong)((long)(src->elements_).
                                   super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar2) >> 3),
      src_offset <= uVar6 - size && size <= uVar6)) &&
     (*(Enum *)&(this->type_).super_ExternType.field_0xc == (src->desc_->type).enum_)) {
    EVar4 = Ok;
    if (size != 0) {
      memmove(pRVar1 + dst_offset,pRVar2 + src_offset,uVar3 << 3);
      EVar4 = Ok;
    }
  }
  return (Result)EVar4;
}

Assistant:

Result Table::Init(Store& store,
                   u32 dst_offset,
                   const ElemSegment& src,
                   u32 src_offset,
                   u32 size) {
  if (IsValidRange(dst_offset, size) && src.IsValidRange(src_offset, size) &&
      TypesMatch(type_.element, src.desc().type)) {
    std::copy(src.elements().begin() + src_offset,
              src.elements().begin() + src_offset + size,
              elements_.begin() + dst_offset);
    return Result::Ok;
  }
  return Result::Error;
}